

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_msl_shader_input(CompilerMSL *this,MSLShaderInterfaceVariable *si)

{
  uint32_t uVar1;
  MSLShaderVariableFormat MVar2;
  BuiltIn BVar3;
  MSLShaderVariableRate MVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  key_type local_18;
  
  local_18.location = si->location;
  local_18.component = si->component;
  pmVar5 = ::std::
           map<spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable,_std::less<spirv_cross::LocationComponentPair>,_std::allocator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>_>
           ::operator[](&this->inputs_by_location,&local_18);
  uVar1 = si->component;
  MVar2 = si->format;
  BVar3 = si->builtin;
  pmVar5->location = si->location;
  pmVar5->component = uVar1;
  pmVar5->format = MVar2;
  pmVar5->builtin = BVar3;
  MVar4 = si->rate;
  pmVar5->vecsize = si->vecsize;
  pmVar5->rate = MVar4;
  if (si->builtin != BuiltInMax) {
    local_18.location = si->builtin;
    sVar6 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->inputs_by_builtin)._M_h,&local_18.location);
    if (sVar6 == 0) {
      local_18.location = si->builtin;
      pmVar7 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->inputs_by_builtin,&local_18.location);
      uVar1 = si->component;
      MVar2 = si->format;
      BVar3 = si->builtin;
      pmVar7->location = si->location;
      pmVar7->component = uVar1;
      pmVar7->format = MVar2;
      pmVar7->builtin = BVar3;
      MVar4 = si->rate;
      pmVar7->vecsize = si->vecsize;
      pmVar7->rate = MVar4;
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_msl_shader_input(const MSLShaderInterfaceVariable &si)
{
	inputs_by_location[{si.location, si.component}] = si;
	if (si.builtin != BuiltInMax && !inputs_by_builtin.count(si.builtin))
		inputs_by_builtin[si.builtin] = si;
}